

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O2

void __thiscall cmInstalledFile::SetName(cmInstalledFile *this,cmMakefile *mf,string *name)

{
  undefined8 __p;
  cmake *cmakeInstance;
  cmListFileBacktrace backtrace;
  cmGeneratorExpression ge;
  undefined1 local_80 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_68;
  undefined1 local_58 [56];
  
  cmMakefile::GetBacktrace((cmMakefile *)(local_80 + 8));
  cmakeInstance = cmMakefile::GetCMakeInstance(mf);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_68,
                 (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)(local_80 + 8));
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_58,cmakeInstance,(cmListFileBacktrace *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::string((string *)(local_58 + 0x18),(string *)name);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_80,(string *)local_58);
  __p = local_80._0_8_;
  local_80._0_8_ =
       (__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        )0x0;
  std::
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ::reset((__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           *)&this->NameExpression,(pointer)__p);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_80);
  std::__cxx11::string::~string((string *)(local_58 + 0x18));
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  return;
}

Assistant:

void cmInstalledFile::SetName(cmMakefile* mf, const std::string& name)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(*mf->GetCMakeInstance(), backtrace);

  this->Name = name;
  this->NameExpression = ge.Parse(name);
}